

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O1

bool __thiscall QScrollArea::eventFilter(QScrollArea *this,QObject *o,QEvent *e)

{
  QScrollAreaPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  QObject *pQVar3;
  
  this_00 = *(QScrollAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  pDVar1 = (this_00->widget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this_00->widget).wp.value;
  }
  if ((pQVar3 == o) && (*(short *)(e + 8) == 0xe)) {
    QScrollAreaPrivate::updateScrollBars(this_00);
  }
  bVar2 = QAbstractScrollArea::eventFilter((QAbstractScrollArea *)this,o,e);
  return bVar2;
}

Assistant:

bool QScrollArea::eventFilter(QObject *o, QEvent *e)
{
    Q_D(QScrollArea);
#ifdef QT_KEYPAD_NAVIGATION
    if (d->widget && o != d->widget && e->type() == QEvent::FocusIn
            && QApplicationPrivate::keypadNavigationEnabled()) {
        if (o->isWidgetType())
            ensureWidgetVisible(static_cast<QWidget *>(o));
    }
#endif
    if (o == d->widget && e->type() == QEvent::Resize)
        d->updateScrollBars();

    return QAbstractScrollArea::eventFilter(o, e);
}